

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O1

size_t __thiscall
helix::nasdaq::nordic_itch_handler::process_packet(nordic_itch_handler *this,packet_view *packet)

{
  itch_order_book_directory *m;
  size_t sVar1;
  long lVar2;
  uint64_t uVar3;
  char *pcVar4;
  
  m = (itch_order_book_directory *)packet->_buf;
  sVar1 = 0;
  switch(m->MsgType) {
  case 'A':
    process_msg(this,(itch_add_order *)m);
    goto LAB_0011844b;
  case 'C':
    process_msg(this,(itch_order_executed_with_price *)m);
    sVar1 = 0x2f;
    break;
  case 'D':
    process_msg(this,(itch_order_delete *)m);
  case 'B':
    sVar1 = 10;
    break;
  case 'E':
    process_msg(this,(itch_order_executed *)m);
LAB_0011844b:
    sVar1 = 0x24;
    break;
  case 'F':
    process_msg(this,(itch_add_order_mpid *)m);
    sVar1 = 0x28;
    break;
  case 'H':
    process_msg(this,(itch_order_book_trading_action *)m);
    sVar1 = 0xd;
    break;
  case 'I':
    sVar1 = 0x4b;
    break;
  case 'M':
    lVar2 = 1;
    do {
      if (m->OrderBook[lVar2 + -1] != ' ') {
        pcVar4 = m->OrderBook + lVar2 + -1;
        break;
      }
      lVar2 = lVar2 + 1;
      pcVar4 = m->OrderBook + 3;
    } while (lVar2 != 4);
    uVar3 = 0;
    for (; pcVar4 != m->OrderBook + 3; pcVar4 = pcVar4 + 1) {
      uVar3 = ((long)*pcVar4 + uVar3 * 10) - 0x30;
    }
    this->time_msec = uVar3;
    sVar1 = 4;
    break;
  case 'O':
    sVar1 = 5;
    break;
  case 'P':
    process_msg(this,(itch_trade *)m);
    sVar1 = 0x35;
    break;
  case 'Q':
    process_msg(this,(itch_cross_trade *)m);
    sVar1 = 0x2e;
    break;
  case 'R':
    process_msg(this,m);
    sVar1 = 0x41;
    break;
  case 'S':
    sVar1 = 2;
    break;
  case 'T':
    lVar2 = 1;
    do {
      if (m->OrderBook[lVar2 + -1] != ' ') {
        pcVar4 = m->OrderBook + lVar2 + -1;
        break;
      }
      lVar2 = lVar2 + 1;
      pcVar4 = m->OrderBook + 5;
    } while (lVar2 != 6);
    uVar3 = 0;
    for (; pcVar4 != m->OrderBook + 5; pcVar4 = pcVar4 + 1) {
      uVar3 = ((long)*pcVar4 + uVar3 * 10) - 0x30;
    }
    this->time_sec = uVar3;
    sVar1 = 6;
    break;
  case 'X':
    process_msg(this,(itch_order_cancel *)m);
    sVar1 = 0x13;
  }
  return sVar1;
}

Assistant:

size_t nordic_itch_handler::process_packet(const net::packet_view& packet)
{
    auto* msg = packet.cast<itch_message>();
    switch (msg->MsgType) {
    case 'T': return process_msg<itch_seconds>(packet);
    case 'M': return process_msg<itch_milliseconds>(packet);
    case 'O': return process_msg<itch_market_segment_state>(packet);
    case 'S': return process_msg<itch_system_event>(packet);
    case 'R': return process_msg<itch_order_book_directory>(packet);
    case 'H': return process_msg<itch_order_book_trading_action>(packet);
    case 'A': return process_msg<itch_add_order>(packet);
    case 'F': return process_msg<itch_add_order_mpid>(packet);
    case 'E': return process_msg<itch_order_executed>(packet);
    case 'C': return process_msg<itch_order_executed_with_price>(packet);
    case 'X': return process_msg<itch_order_cancel>(packet);
    case 'D': return process_msg<itch_order_delete>(packet);
    case 'P': return process_msg<itch_trade>(packet);
    case 'Q': return process_msg<itch_cross_trade>(packet);
    case 'B': return process_msg<itch_broken_trade>(packet);
    case 'I': return process_msg<itch_noii>(packet);
    default:  return 0;
    }
}